

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

bool __thiscall QPDF::allowPrintHighRes(QPDF *this)

{
  bool bVar1;
  bool bVar2;
  int P;
  int R;
  uint local_8 [2];
  
  local_8[0] = 0;
  local_8[1] = 0;
  bVar1 = isEncrypted(this,(int *)(local_8 + 1),(int *)local_8);
  bVar2 = true;
  if (bVar1) {
    if ((int)local_8[1] < 3) {
      bVar2 = SUB41((local_8[0] & 4) >> 2,0);
    }
    else {
      bVar2 = (~local_8[0] & 0x804) == 0;
    }
  }
  return bVar2;
}

Assistant:

bool
QPDF::allowPrintHighRes()
{
    int R = 0;
    int P = 0;
    bool status = true;
    if (isEncrypted(R, P)) {
        status = is_bit_set(P, 3);
        if ((R >= 3) && (!is_bit_set(P, 12))) {
            status = false;
        }
    }
    return status;
}